

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O1

void __thiscall tcmalloc::StringGenericWriter::~StringGenericWriter(StringGenericWriter *this)

{
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__StringGenericWriter_001429f8
  ;
  RecycleBuffer(this,(this->super_GenericWriter).buf_,(this->super_GenericWriter).buf_fill_,0);
  (this->super_GenericWriter).buf_fill_ = (this->super_GenericWriter).buf_;
  if (this->unused_size_ != 0) {
    std::__cxx11::string::resize
              ((ulong)this->s_,(char)this->s_->_M_string_length - (char)this->unused_size_);
  }
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__GenericWriter_001429d0;
  return;
}

Assistant:

StringGenericWriter::~StringGenericWriter() {
  FinalRecycle();
  if (unused_size_) {
    s_->resize(s_->size() - unused_size_);
  }
}